

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cc
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  Size SVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  undefined8 uVar11;
  uint __val;
  Size SVar12;
  size_type sVar13;
  uint __len;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> smiles;
  string img_name;
  string smile_name;
  Mat img;
  Mat image_gray;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long local_1b0;
  long lStack_1a8;
  _InputArray local_1a0;
  void *local_188;
  undefined8 uStack_180;
  long local_178;
  long *local_170 [2];
  long local_160 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [3];
  Mat local_90 [96];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nThis program demonstrates the smile detector.\nContains two functions:\n1.Converting Video Files to Pictures.\n2.Extract the smiling pictures from the pictures.\n\nUsage:\n./smile [--url=<the URL of the incoming video>]\n\nExample:\n./videocover http://vodm2lzexwq.vod.126.net/vodm2lzexwq/4673d4ae-7078-42c1-affb-494b4ad0e687.mp4?resId=254486990bfa2cd7aa860229db639341_1919639027_0&sign=i9VRqSZZJDUI%2B3hka7EpMg12silSgknLl2iTUoyqKT8%3D\n\n"
               ,0x1ad);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tUsing OpenCV version 4.0.1.\n\n\n",0x1f);
    return 0;
  }
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"smile.png","");
  iVar5 = download(argv[1],"video.mp4");
  if (iVar5 == -1) {
    printf("[%s][%s(%d)]:Download video error.\n","MSG_ERROR","main",0x34);
    uVar11 = 0x35;
  }
  else {
    printf("[%s][%s(%d)]:Download video successful!\n","MSG_INFO","main",0x38);
    iVar5 = mkdir("./video",0x1ff);
    if (iVar5 == -1) {
      printf("[%s][%s(%d)]:Create dir error!\n","MSG_ERROR","main",0x3b);
      uVar11 = 0x3c;
    }
    else {
      printf("[%s][%s(%d)]:Create dir successful!\n","MSG_INFO","main",0x3f);
      video_to_image("video.mp4","./video");
      printf("[%s][%s(%d)]:Video convert image successful!\n","MSG_INFO","main",0x46);
      __val = 1;
      do {
        std::operator+(local_f0,"./video",&forward_slash_abi_cxx11_);
        __len = 1;
        if (9 < __val) {
          uVar9 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar6 = (uint)uVar9;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_00105773;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_00105773;
            }
            if (uVar6 < 10000) goto LAB_00105773;
            uVar9 = uVar9 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_00105773:
        local_1e0 = &local_1d0;
        std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0,__len,__val);
        uVar11._0_4_ = 0xf;
        uVar11._4_4_ = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
          uVar11 = local_f0[0].field_2._M_allocated_capacity;
        }
        SVar2 = (Size)((long)&(local_1d8->_M_dataplus)._M_p + local_f0[0]._M_string_length);
        if ((ulong)uVar11 < (ulong)SVar2) {
          SVar12.width = 0xf;
          SVar12.height = 0;
          if (local_1e0 != &local_1d0) {
            SVar12 = (Size)local_1d0._M_dataplus;
          }
          if ((ulong)SVar12 < (ulong)SVar2) goto LAB_001057ef;
          sVar13 = local_f0[0]._M_string_length;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_f0[0]._M_dataplus._M_p);
          iVar5 = (int)sVar13;
        }
        else {
LAB_001057ef:
          sVar13 = local_f0[0]._M_string_length;
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_1e0);
          iVar5 = (int)sVar13;
        }
        local_150[0]._M_dataplus._M_p = (pointer)&local_150[0].field_2;
        psVar1 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_150[0].field_2._0_8_ = *psVar1;
          local_150[0].field_2._8_8_ = puVar7[3];
        }
        else {
          local_150[0].field_2._0_8_ = *psVar1;
          local_150[0]._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_150[0]._M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_150,(ulong)suffix_png_abi_cxx11_._M_dataplus._M_p)
        ;
        local_1d0.field_2._M_allocated_capacity = (size_type)&local_1b0;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_1b0 = *plVar10;
          lStack_1a8 = plVar8[3];
        }
        else {
          local_1b0 = *plVar10;
          local_1d0.field_2._M_allocated_capacity = (size_type)(long *)*plVar8;
        }
        local_1d0.field_2._8_8_ = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
          operator_delete(local_150[0]._M_dataplus._M_p,
                          local_150[0].field_2._M_allocated_capacity + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,(long)local_1d0._M_dataplus._M_p + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
          operator_delete(local_f0[0]._M_dataplus._M_p,local_f0[0].field_2._M_allocated_capacity + 1
                         );
        }
        cv::imread((string *)local_150,(int)&local_1d0 + 0x10);
        cVar4 = cv::Mat::empty();
        if (cVar4 != '\0') {
          cv::Mat::~Mat((Mat *)local_150);
          if ((long *)local_1d0.field_2._M_allocated_capacity != &local_1b0) {
            operator_delete((void *)local_1d0.field_2._M_allocated_capacity,local_1b0 + 1);
          }
          break;
        }
        cv::Mat::Mat((Mat *)local_f0);
        local_1d0._M_dataplus._M_p = (pointer)0x0;
        local_1e0._0_4_ = 0x1010000;
        local_1d8 = local_150;
        local_1a0.sz.width = 0;
        local_1a0.sz.height = 0;
        local_1a0.flags = 0x2010000;
        local_1a0.obj = local_f0;
        cv::cvtColor((cv *)&local_1e0,&local_1a0,(_OutputArray *)0x6,0,iVar5);
        local_1d0._M_dataplus._M_p = (pointer)0x0;
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(local_1e0._4_4_,0x1010000);
        local_1a0.sz.width = 0;
        local_1a0.sz.height = 0;
        local_1a0.flags = 0x2010000;
        local_1d8 = local_f0;
        local_1a0.obj = local_f0;
        cv::equalizeHist((_InputArray *)&local_1e0,(_OutputArray *)&local_1a0);
        cv::Mat::Mat(local_90,(Mat *)local_f0);
        detectSmile((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&local_1e0,local_90)
        ;
        cv::Mat::~Mat(local_90);
        if (local_1e0 != local_1d8) {
          local_1a0.sz.width = 0;
          local_1a0.sz.height = 0;
          local_1a0.flags = 0x1010000;
          local_1a0.obj = local_150;
          local_178 = 0;
          local_188 = (void *)0x0;
          uStack_180 = 0;
          cv::imwrite((string *)local_170,&local_1a0,(vector *)&local_188);
          if (local_188 != (void *)0x0) {
            operator_delete(local_188,local_178 - (long)local_188);
          }
        }
        if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(local_1e0,(long)local_1d0._M_dataplus._M_p - (long)local_1e0);
        }
        cv::Mat::~Mat((Mat *)local_f0);
        cv::Mat::~Mat((Mat *)local_150);
        if ((long *)local_1d0.field_2._M_allocated_capacity != &local_1b0) {
          operator_delete((void *)local_1d0.field_2._M_allocated_capacity,local_1b0 + 1);
        }
        __val = __val + 1;
      } while (__val != 9999);
      printf("[%s][%s(%d)]:Smile detector successful!\n","MSG_INFO","main",0x58);
      iVar5 = __rmdir__("./video");
      if (iVar5 != -1) {
        iVar5 = 0;
        printf("[%s][%s(%d)]:Delete temp dir successful!\n","MSG_INFO","main",0x5f);
        goto LAB_00105c19;
      }
      printf("[%s][%s(%d)]:Delete temp dir error.\n","MSG_ERROR","main",0x5b);
      uVar11 = 0x5c;
    }
  }
  printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",uVar11);
  iVar5 = -1;
LAB_00105c19:
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  return iVar5;
}

Assistant:

int main(int argc, const char *argv[]) {
  if (argc < 2) {
    help();
    return 0;
  }
  const char *video_name = "video.mp4";
  const char *dir_name = "./video";
  string smile_name = "smile.png";
  if (download(argv[1], video_name) == -1) {
    lprintf(MSG_ERROR, "Download video error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Download video successful!\n");

  if (__mkdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Create dir error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Create dir successful!\n");

  if (video_to_image(video_name, dir_name) == -1) {
    lprintf(MSG_ERROR, "Video file conversion error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Video convert image successful!\n");

  // Read the image, convert it into gray image, and then equalize the
  // histogram.
  for (int i = 1; i < 9999; i++) {
    string img_name = dir_name + forward_slash + to_string(i) + suffix_png;

    Mat img = imread(img_name);
    if (img.empty()) break;

    Mat image_gray;
    cvtColor(img, image_gray, COLOR_BGR2GRAY);
    equalizeHist(image_gray, image_gray);

    vector<Rect> smiles = detectSmile(image_gray);

    if (!smiles.empty()) imwrite(smile_name, img);
  }
  lprintf(MSG_INFO, "Smile detector successful!\n");

  if (__rmdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Delete temp dir error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Delete temp dir successful!\n");

  return 0;
}